

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void V_Destr(Vector *V)

{
  Vector *V_local;
  
  if (V->Name != (char *)0x0) {
    free(V->Name);
  }
  if ((V->OwnData != False) && (V->Cmp != (Real *)0x0)) {
    free(V->Cmp);
    V->Cmp = (Real *)0x0;
  }
  return;
}

Assistant:

void V_Destr(Vector *V)
/* destructor of the type Vector */
{
    if (V->Name != NULL)
        free(V->Name);
    if (V->OwnData) {
        if (V->Cmp != NULL) {
            free(V->Cmp);
            V->Cmp = NULL;
        }
    }
}